

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::roundToMagnitude
          (DecimalQuantity *this,int32_t magnitude,RoundingMode roundingMode,UErrorCode *status)

{
  char cVar1;
  bool bVar2;
  int8_t iVar3;
  byte bVar4;
  bool bVar5;
  int32_t position;
  int32_t iVar6;
  int iVar7;
  int position_00;
  Section section;
  
LAB_00220446:
  position = anon_unknown.dwarf_a771a::safeSubtract(magnitude,this->scale);
  cVar1 = this->isApproximate;
  if (position < 1 && cVar1 == '\0') {
    return;
  }
  iVar7 = this->precision;
  if (iVar7 == 0) {
    return;
  }
  iVar3 = getDigitPos(this,position + -1);
  bVar4 = getDigitPos(this,position);
  if (cVar1 != '\0') {
    position_00 = position + -2;
    if (position < -0x7ffffffe) {
      position_00 = -0x80000000;
    }
    iVar6 = uprv_max_63(0,iVar7 + -0xe);
    switch(iVar3) {
    case '\0':
      do {
        bVar5 = iVar6 <= position_00;
        if (position_00 < iVar6) break;
        iVar3 = getDigitPos(this,position_00);
        position_00 = position_00 + -1;
      } while (iVar3 == '\0');
      bVar2 = false;
      break;
    default:
      section = (uint)('\x04' < iVar3) * 2 + SECTION_LOWER;
      bVar5 = true;
      bVar2 = false;
      goto LAB_00220575;
    case '\x04':
      do {
        bVar5 = true;
        bVar2 = position_00 < iVar6;
        if (position_00 < iVar6) goto LAB_00220571;
        iVar3 = getDigitPos(this,position_00);
        position_00 = position_00 + -1;
      } while (iVar3 == '\t');
      break;
    case '\x05':
      do {
        bVar5 = true;
        bVar2 = position_00 < iVar6;
        if (position_00 < iVar6) goto LAB_00220571;
        iVar3 = getDigitPos(this,position_00);
        position_00 = position_00 + -1;
      } while (iVar3 == '\0');
      goto LAB_0022056d;
    case '\t':
      do {
        bVar5 = iVar6 <= position_00;
        if (position_00 < iVar6) break;
        iVar3 = getDigitPos(this,position_00);
        position_00 = position_00 + -1;
      } while (iVar3 == '\t');
      bVar2 = false;
LAB_0022056d:
      section = SECTION_UPPER;
      goto LAB_00220575;
    }
    section = SECTION_LOWER;
    goto LAB_00220575;
  }
  if (iVar3 < '\x05') {
    section = SECTION_LOWER;
    goto LAB_0022061f;
  }
  section = SECTION_UPPER;
  if (iVar3 != '\x05') goto LAB_0022061f;
  iVar7 = -0x80000000;
  if (-0x7fffffff < position) {
    iVar7 = position + -2;
  }
  goto LAB_00220606;
LAB_00220571:
  bVar5 = true;
  section = SECTION_MIDPOINT;
LAB_00220575:
  if ((((bool)(bVar5 | UNUM_ROUND_UP < roundingMode)) &&
      (!(bool)(UNUM_ROUND_UP < roundingMode & bVar2))) && (this->precision + -0xe <= position + -1))
  {
    this->origDouble = 0.0;
    this->origDelta = 0;
    this->isApproximate = '\0';
    if (position < 1) {
      return;
    }
    goto LAB_0022061f;
  }
  convertToAccurateDouble(this);
  goto LAB_00220446;
  while( true ) {
    iVar3 = getDigitPos(this,iVar7);
    iVar7 = iVar7 + -1;
    if (iVar3 != '\0') break;
LAB_00220606:
    if (iVar7 < 0) {
      section = SECTION_MIDPOINT;
      break;
    }
  }
LAB_0022061f:
  bVar5 = roundingutils::getRoundingDirection
                    ((bVar4 & 1) == 0,(bool)(this->flags & 1),section,roundingMode,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (position < this->precision) {
    shiftRight(this,position);
  }
  else {
    setBcdToZero(this);
    this->scale = magnitude;
  }
  if (!bVar5) {
    if (bVar4 == 9) {
      iVar7 = -1;
      do {
        iVar7 = iVar7 + 1;
        iVar3 = getDigitPos(this,iVar7);
      } while (iVar3 == '\t');
      shiftRight(this,iVar7);
    }
    iVar3 = getDigitPos(this,0);
    setDigitPos(this,0,iVar3 + '\x01');
    this->precision = this->precision + 1;
  }
  compact(this);
  return;
}

Assistant:

void DecimalQuantity::roundToMagnitude(int32_t magnitude, RoundingMode roundingMode, UErrorCode& status) {
    // The position in the BCD at which rounding will be performed; digits to the right of position
    // will be rounded away.
    // TODO: Andy: There was a test failure because of integer overflow here. Should I do
    // "safe subtraction" everywhere in the code?  What's the nicest way to do it?
    int position = safeSubtract(magnitude, scale);

    if (position <= 0 && !isApproximate) {
        // All digits are to the left of the rounding magnitude.
    } else if (precision == 0) {
        // No rounding for zero.
    } else {
        // Perform rounding logic.
        // "leading" = most significant digit to the right of rounding
        // "trailing" = least significant digit to the left of rounding
        int8_t leadingDigit = getDigitPos(safeSubtract(position, 1));
        int8_t trailingDigit = getDigitPos(position);

        // Compute which section of the number we are in.
        // EDGE means we are at the bottom or top edge, like 1.000 or 1.999 (used by doubles)
        // LOWER means we are between the bottom edge and the midpoint, like 1.391
        // MIDPOINT means we are exactly in the middle, like 1.500
        // UPPER means we are between the midpoint and the top edge, like 1.916
        roundingutils::Section section = roundingutils::SECTION_MIDPOINT;
        if (!isApproximate) {
            if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else if (leadingDigit > 5) {
                section = roundingutils::SECTION_UPPER;
            } else {
                for (int p = safeSubtract(position, 2); p >= 0; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            }
        } else {
            int32_t p = safeSubtract(position, 2);
            int32_t minP = uprv_max(0, precision - 14);
            if (leadingDigit == 0) {
                section = roundingutils::SECTION_LOWER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 4) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 5) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit == 9) {
                section = roundingutils::SECTION_UPPER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else {
                section = roundingutils::SECTION_UPPER;
            }

            bool roundsAtMidpoint = roundingutils::roundsAtMidpoint(roundingMode);
            if (safeSubtract(position, 1) < precision - 14 ||
                (roundsAtMidpoint && section == roundingutils::SECTION_MIDPOINT) ||
                (!roundsAtMidpoint && section < 0 /* i.e. at upper or lower edge */)) {
                // Oops! This means that we have to get the exact representation of the double, because
                // the zone of uncertainty is along the rounding boundary.
                convertToAccurateDouble();
                roundToMagnitude(magnitude, roundingMode, status); // start over
                return;
            }

            // Turn off the approximate double flag, since the value is now confirmed to be exact.
            isApproximate = false;
            origDouble = 0.0;
            origDelta = 0;

            if (position <= 0) {
                // All digits are to the left of the rounding magnitude.
                return;
            }

            // Good to continue rounding.
            if (section == -1) { section = roundingutils::SECTION_LOWER; }
            if (section == -2) { section = roundingutils::SECTION_UPPER; }
        }

        bool roundDown = roundingutils::getRoundingDirection((trailingDigit % 2) == 0,
                isNegative(),
                section,
                roundingMode,
                status);
        if (U_FAILURE(status)) {
            return;
        }

        // Perform truncation
        if (position >= precision) {
            setBcdToZero();
            scale = magnitude;
        } else {
            shiftRight(position);
        }

        // Bubble the result to the higher digits
        if (!roundDown) {
            if (trailingDigit == 9) {
                int bubblePos = 0;
                // Note: in the long implementation, the most digits BCD can have at this point is 15,
                // so bubblePos <= 15 and getDigitPos(bubblePos) is safe.
                for (; getDigitPos(bubblePos) == 9; bubblePos++) {}
                shiftRight(bubblePos); // shift off the trailing 9s
            }
            int8_t digit0 = getDigitPos(0);
            U_ASSERT(digit0 != 9);
            setDigitPos(0, static_cast<int8_t>(digit0 + 1));
            precision += 1; // in case an extra digit got added
        }

        compact();
    }
}